

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

bool isItRandom<KarpRabinHash<unsigned_long_long,unsigned_char>>(uint L)

{
  undefined1 auVar1 [16];
  value_type *__val;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  ostream *poVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  KarpRabinHash<unsigned_long_long,_unsigned_char> base;
  KarpRabinHash<unsigned_long_long,_unsigned_char> hf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1088;
  KarpRabinHash<unsigned_long_long,_unsigned_char> local_1070;
  KarpRabinHash<unsigned_long_long,_unsigned_char> local_850;
  long lVar9;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"checking that it is randomized ",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(5);
  local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 5;
  *local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = '\0';
  local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  auVar1 = _DAT_0010b070;
  local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  lVar5 = 0;
  auVar8 = _DAT_0010b060;
  do {
    if (SUB164(auVar8 ^ auVar1,4) == -0x80000000 && SUB164(auVar8 ^ auVar1,0) < -0x7ffffffb) {
      local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5] = (uchar)lVar5;
      local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar5 + 1] = (uchar)lVar5 + '\x01';
    }
    lVar5 = lVar5 + 2;
    lVar9 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 2;
    auVar8._8_8_ = lVar9 + 2;
  } while (lVar5 != 6);
  local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  KarpRabinHash<unsigned_long_long,_unsigned_char>::KarpRabinHash(&local_1070,5,L);
  uVar2 = KarpRabinHash<unsigned_long_long,unsigned_char>::
          hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((KarpRabinHash<unsigned_long_long,unsigned_char> *)&local_1070,&local_1088);
  uVar6 = 0;
  bVar7 = true;
  do {
    KarpRabinHash<unsigned_long_long,_unsigned_char>::KarpRabinHash(&local_850,5,L);
    uVar3 = KarpRabinHash<unsigned_long_long,unsigned_char>::
            hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((KarpRabinHash<unsigned_long_long,unsigned_char> *)&local_850,&local_1088);
    if (uVar3 != uVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"It is randomized! ",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      goto LAB_00104009;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"collision ",10);
    poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    bVar7 = uVar6 < 99;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not randomized! ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  bVar7 = false;
LAB_00104009:
  if (local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1088.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar7;
}

Assistant:

bool isItRandom(uint L = 19) {
  cout << "checking that it is randomized " << endl;
  int n = 5;
  vector<unsigned char> data(n);
  for (int k = 0; k < n; ++k) {
    data[k] = static_cast<unsigned char>(k);
  }
  hashfunction base(n, L);
  uint64 x = base.hash(data);
  for (int k = 0; k < 100; ++k) {
    hashfunction hf(n, L);
    uint64 y = hf.hash(data);
    if (y != x) {
      cout << "It is randomized! " << endl;
      return true;
    }
    cout << "collision " << y << endl;
  }
  cout << "Not randomized! " << endl;
  return false; // we conclude that it always hashes to the same value (this is
                // bad)
}